

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  string *psVar4;
  cmValue cVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string ruleVar;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  undefined8 local_38;
  char *local_30;
  
  psVar4 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar4->_M_string_length);
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_58,this);
  bVar3 = cmGeneratorTarget::HasImplibGNUtoMS(pcVar2,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_(&local_98,this);
    cmGeneratorTarget::GetLinkerLanguage(&local_b8,pcVar2,&local_98);
    local_58._M_dataplus._M_p = (pointer)0x6;
    local_58._M_string_length = 0x7cc7b3;
    local_58.field_2._M_allocated_capacity = local_b8._M_string_length;
    local_58.field_2._8_8_ = local_b8._M_dataplus._M_p;
    local_38 = 0xd;
    local_30 = "_GNUtoMS_RULE";
    views._M_len = 3;
    views._M_array = (iterator)&local_58;
    cmCatViews_abi_cxx11_(&local_78,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    cVar5 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_78);
    if (cVar5.Value != (string *)0x0) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)((cVar5.Value)->_M_dataplus)._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->GetConfigName())) {
    std::string ruleVar =
      cmStrCat("CMAKE_",
               this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName()),
               "_GNUtoMS_RULE");
    if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += *rule;
    }
  }
  return linkRule;
}